

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O1

void __thiscall QDialog::keyPressEvent(QDialog *this,QKeyEvent *e)

{
  QPushButton *this_00;
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QList<QPushButton_*> list;
  QArrayData *local_38;
  long lStack_30;
  ulong local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QKeyEvent::matches((StandardKey)e);
  if (cVar1 == '\0') {
    iVar3 = QKeyEvent::modifiers();
    if (((iVar3 == 0) ||
        ((uVar4 = QKeyEvent::modifiers(), (uVar4 >> 0x1d & 1) != 0 &&
         (*(int *)(e + 0x40) == 0x1000005)))) && ((*(uint *)(e + 0x40) & 0xfffffffe) == 0x1000004))
    {
      local_38 = (QArrayData *)0x0;
      lStack_30 = 0;
      local_28 = 0;
      qt_qFindChildren_helper(this,0,0,&QPushButton::staticMetaObject,&local_38,1);
      if (local_28 != 0) {
        uVar5 = 0;
        do {
          this_00 = *(QPushButton **)(lStack_30 + uVar5 * 8);
          bVar2 = QPushButton::isDefault(this_00);
          if ((bVar2) &&
             (uVar4 = ((this_00->super_QAbstractButton).super_QWidget.data)->widget_attributes,
             (short)uVar4 < 0)) {
            if ((uVar4 & 1) == 0) {
              QAbstractButton::click(&this_00->super_QAbstractButton);
            }
            break;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < local_28);
      }
      if (local_38 != (QArrayData *)0x0) {
        LOCK();
        (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_38,8,0x10);
        }
      }
    }
    else {
      e[0xc] = (QKeyEvent)0x0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    (**(code **)(*(long *)&this->super_QWidget + 0x1c0))(this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialog::keyPressEvent(QKeyEvent *e)
{
#ifndef QT_NO_SHORTCUT
    //   Calls reject() if Escape is pressed. Simulates a button
    //   click for the default button if Enter is pressed. Move focus
    //   for the arrow keys. Ignore the rest.
    if (e->matches(QKeySequence::Cancel)) {
        reject();
    } else
#endif
    if (!e->modifiers() || (e->modifiers() & Qt::KeypadModifier && e->key() == Qt::Key_Enter)) {
        switch (e->key()) {
#if QT_CONFIG(pushbutton)
        case Qt::Key_Enter:
        case Qt::Key_Return: {
            QList<QPushButton*> list = findChildren<QPushButton*>();
            for (int i=0; i<list.size(); ++i) {
                QPushButton *pb = list.at(i);
                if (pb->isDefault() && pb->isVisible()) {
                    if (pb->isEnabled())
                        pb->click();
                    return;
                }
            }
        }
        break;
#endif
        default:
            e->ignore();
            return;
        }
    } else {
        e->ignore();
    }
}